

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O2

bool wallet::DumpWallet(ArgsManager *args,WalletDatabase *db,bilingual_str *error)

{
  long lVar1;
  long *plVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  string *strDefault;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  Span<const_unsigned_char> s_01;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_3f8;
  long lStack_3e0;
  long *local_3d8;
  long *local_3d0;
  string local_3c8;
  string value_str;
  undefined1 local_388 [8];
  pointer pbStack_380;
  pointer local_378;
  long lStack_370;
  string format;
  HashWriter hasher;
  string line;
  string key_str;
  ofstream dump_file;
  byte abStack_260 [480];
  path path;
  string dump_filename;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dump_file,"-dumpfile",(allocator<char> *)&key_str);
  std::__cxx11::string::string<std::allocator<char>>((string *)&hasher,"",(allocator<char> *)&path);
  strDefault = (string *)&hasher;
  ArgsManager::GetArg(&dump_filename,args,(string *)&dump_file,strDefault);
  std::__cxx11::string::~string((string *)&hasher);
  std::__cxx11::string::~string((string *)&dump_file);
  if (dump_filename._M_string_length == 0) {
    _((bilingual_str *)&dump_file,(ConstevalStringLiteral)0x3e2c46);
    bilingual_str::operator=(error,(bilingual_str *)&dump_file);
    bilingual_str::~bilingual_str((bilingual_str *)&dump_file);
    bVar3 = false;
  }
  else {
    fs::PathFromString(&path,&dump_filename);
    fs::absolute((path *)&dump_file,&path);
    std::filesystem::__cxx11::path::operator=(&path.super_path,(path *)&dump_file);
    std::filesystem::__cxx11::path::~path((path *)&dump_file);
    bVar3 = std::filesystem::exists(&path.super_path);
    if (bVar3) {
      _((bilingual_str *)&hasher,(ConstevalStringLiteral)0x3e2c91);
      std::filesystem::__cxx11::path::string(&key_str,&path.super_path);
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)&dump_file,(tinyformat *)&hasher,(bilingual_str *)&key_str,
                 strDefault);
      bilingual_str::operator=(error,(bilingual_str *)&dump_file);
      bilingual_str::~bilingual_str((bilingual_str *)&dump_file);
      std::__cxx11::string::~string((string *)&key_str);
      bilingual_str::~bilingual_str((bilingual_str *)&hasher);
      bVar3 = false;
    }
    else {
      std::ofstream::ofstream(&dump_file);
      std::ofstream::open((char *)&dump_file,
                          (_Ios_Openmode)path.super_path._M_pathname._M_dataplus._M_p);
      if ((abStack_260[*(long *)(_dump_file + -0x18)] & 5) == 0) {
        hasher.ctx.buf[0x30] = '\0';
        hasher.ctx.buf[0x31] = '\0';
        hasher.ctx.buf[0x32] = '\0';
        hasher.ctx.buf[0x33] = '\0';
        hasher.ctx.buf[0x34] = '\0';
        hasher.ctx.buf[0x35] = '\0';
        hasher.ctx.buf[0x36] = '\0';
        hasher.ctx.buf[0x37] = '\0';
        hasher.ctx.buf[0x38] = '\0';
        hasher.ctx.buf[0x39] = '\0';
        hasher.ctx.buf[0x3a] = '\0';
        hasher.ctx.buf[0x3b] = '\0';
        hasher.ctx.buf[0x3c] = '\0';
        hasher.ctx.buf[0x3d] = '\0';
        hasher.ctx.buf[0x3e] = '\0';
        hasher.ctx.buf[0x3f] = '\0';
        hasher.ctx.buf[0x20] = '\0';
        hasher.ctx.buf[0x21] = '\0';
        hasher.ctx.buf[0x22] = '\0';
        hasher.ctx.buf[0x23] = '\0';
        hasher.ctx.buf[0x24] = '\0';
        hasher.ctx.buf[0x25] = '\0';
        hasher.ctx.buf[0x26] = '\0';
        hasher.ctx.buf[0x27] = '\0';
        hasher.ctx.buf[0x28] = '\0';
        hasher.ctx.buf[0x29] = '\0';
        hasher.ctx.buf[0x2a] = '\0';
        hasher.ctx.buf[0x2b] = '\0';
        hasher.ctx.buf[0x2c] = '\0';
        hasher.ctx.buf[0x2d] = '\0';
        hasher.ctx.buf[0x2e] = '\0';
        hasher.ctx.buf[0x2f] = '\0';
        hasher.ctx.buf[0x10] = '\0';
        hasher.ctx.buf[0x11] = '\0';
        hasher.ctx.buf[0x12] = '\0';
        hasher.ctx.buf[0x13] = '\0';
        hasher.ctx.buf[0x14] = '\0';
        hasher.ctx.buf[0x15] = '\0';
        hasher.ctx.buf[0x16] = '\0';
        hasher.ctx.buf[0x17] = '\0';
        hasher.ctx.buf[0x18] = '\0';
        hasher.ctx.buf[0x19] = '\0';
        hasher.ctx.buf[0x1a] = '\0';
        hasher.ctx.buf[0x1b] = '\0';
        hasher.ctx.buf[0x1c] = '\0';
        hasher.ctx.buf[0x1d] = '\0';
        hasher.ctx.buf[0x1e] = '\0';
        hasher.ctx.buf[0x1f] = '\0';
        hasher.ctx.buf[0] = '\0';
        hasher.ctx.buf[1] = '\0';
        hasher.ctx.buf[2] = '\0';
        hasher.ctx.buf[3] = '\0';
        hasher.ctx.buf[4] = '\0';
        hasher.ctx.buf[5] = '\0';
        hasher.ctx.buf[6] = '\0';
        hasher.ctx.buf[7] = '\0';
        hasher.ctx.buf[8] = '\0';
        hasher.ctx.buf[9] = '\0';
        hasher.ctx.buf[10] = '\0';
        hasher.ctx.buf[0xb] = '\0';
        hasher.ctx.buf[0xc] = '\0';
        hasher.ctx.buf[0xd] = '\0';
        hasher.ctx.buf[0xe] = '\0';
        hasher.ctx.buf[0xf] = '\0';
        hasher.ctx.s[4] = 0;
        hasher.ctx.s[5] = 0;
        hasher.ctx.s[6] = 0;
        hasher.ctx.s[7] = 0;
        hasher.ctx.s[0] = 0;
        hasher.ctx.s[1] = 0;
        hasher.ctx.s[2] = 0;
        hasher.ctx.s[3] = 0;
        hasher.ctx.bytes = 0;
        CSHA256::CSHA256(&hasher.ctx);
        (*db->_vptr_WalletDatabase[0xe])(&local_3d0,db,1);
        (**(code **)(*local_3d0 + 0x48))(&local_3d8);
        bVar3 = local_3d8 != (long *)0x0;
        if (!bVar3) {
          _((bilingual_str *)&key_str,(ConstevalStringLiteral)0x3e2d0c);
          bilingual_str::operator=(error,(bilingual_str *)&key_str);
          bilingual_str::~bilingual_str((bilingual_str *)&key_str);
        }
        tinyformat::format<std::__cxx11::string,unsigned_int>
                  (&line,(tinyformat *)"%s,%u\n",DUMP_MAGIC_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &DUMP_VERSION,(uint *)in_R8);
        std::ostream::write((char *)&dump_file,(long)line._M_dataplus._M_p);
        key_str._M_dataplus = line._M_dataplus;
        key_str._M_string_length = line._M_string_length;
        HashWriter::operator<<(&hasher,(Span<char> *)&key_str);
        (*db->_vptr_WalletDatabase[0xd])(&format,db);
        bVar4 = std::operator==(&format,"bdb_ro");
        if (bVar4) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (&format,"bdb");
        }
        tinyformat::format<char[7],std::__cxx11::string>
                  (&key_str,(tinyformat *)"%s,%s\n","format",(char (*) [7])&format,in_R8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&line,&key_str);
        std::__cxx11::string::~string((string *)&key_str);
        std::ostream::write((char *)&dump_file,(long)line._M_dataplus._M_p);
        key_str._M_dataplus = line._M_dataplus;
        key_str._M_string_length = line._M_string_length;
        HashWriter::operator<<(&hasher,(Span<char> *)&key_str);
        if (bVar3) {
          do {
            local_378 = (pointer)0x0;
            lStack_370 = 0;
            local_388 = (undefined1  [8])0x0;
            pbStack_380 = (pointer)0x0;
            local_3f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            lStack_3e0 = 0;
            local_3f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_3f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            iVar5 = (**(code **)(*local_3d8 + 0x10))
                              (local_3d8,
                               (_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
                               local_388,&local_3f8);
            if (iVar5 == 0) {
              _((bilingual_str *)&key_str,(ConstevalStringLiteral)0x3e2d4d);
              bilingual_str::operator=(error,(bilingual_str *)&key_str);
              bilingual_str::~bilingual_str((bilingual_str *)&key_str);
              bVar4 = false;
              bVar3 = false;
            }
            else if (iVar5 == 2) {
              bVar3 = true;
              bVar4 = false;
            }
            else {
              s.m_data = (pointer)((long)local_388 + lStack_370);
              s.m_size = (long)pbStack_380 - (long)s.m_data;
              HexStr_abi_cxx11_(&key_str,s);
              s_00.m_data = local_3f8._M_impl.super__Vector_impl_data._M_start + lStack_3e0;
              s_00.m_size = (long)local_3f8._M_impl.super__Vector_impl_data._M_finish -
                            (long)s_00.m_data;
              HexStr_abi_cxx11_(&value_str,s_00);
              tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                        (&local_3c8,(tinyformat *)"%s,%s\n",(char *)&key_str,&value_str,in_R8);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&line,&local_3c8);
              std::__cxx11::string::~string((string *)&local_3c8);
              std::ostream::write((char *)&dump_file,(long)line._M_dataplus._M_p);
              local_3c8._M_dataplus._M_p = line._M_dataplus._M_p;
              local_3c8._M_string_length = line._M_string_length;
              HashWriter::operator<<(&hasher,(Span<char> *)&local_3c8);
              std::__cxx11::string::~string((string *)&value_str);
              std::__cxx11::string::~string((string *)&key_str);
              bVar4 = true;
            }
            std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                      (&local_3f8);
            std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                      ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_388);
          } while (bVar4);
        }
        plVar2 = local_3d8;
        local_3d8 = (long *)0x0;
        if (plVar2 != (long *)0x0) {
          (**(code **)(*plVar2 + 8))();
        }
        plVar2 = local_3d0;
        local_3d0 = (long *)0x0;
        if (plVar2 != (long *)0x0) {
          (**(code **)(*plVar2 + 0x28))();
        }
        if (bVar3) {
          HashWriter::GetHash((uint256 *)local_388,&hasher);
          s_01.m_size = 0x20;
          s_01.m_data = local_388;
          HexStr_abi_cxx11_(&key_str,s_01);
          tinyformat::format<std::__cxx11::string>((ostream *)&dump_file,"checksum,%s\n",&key_str);
          std::__cxx11::string::~string((string *)&key_str);
          std::ofstream::close();
        }
        else {
          std::ofstream::close();
          std::filesystem::remove((path *)&path);
        }
        std::__cxx11::string::~string((string *)&format);
        std::__cxx11::string::~string((string *)&line);
        if (local_3d8 != (long *)0x0) {
          (**(code **)(*local_3d8 + 8))();
        }
        if (local_3d0 != (long *)0x0) {
          (**(code **)(*local_3d0 + 0x28))();
        }
      }
      else {
        _((bilingual_str *)&key_str,(ConstevalStringLiteral)0x3e2cee);
        std::filesystem::__cxx11::path::string(&line,&path.super_path);
        tinyformat::format<std::__cxx11::string>
                  ((bilingual_str *)&hasher,(tinyformat *)&key_str,(bilingual_str *)&line,strDefault
                  );
        bilingual_str::operator=(error,(bilingual_str *)&hasher);
        bilingual_str::~bilingual_str((bilingual_str *)&hasher);
        std::__cxx11::string::~string((string *)&line);
        bilingual_str::~bilingual_str((bilingual_str *)&key_str);
        bVar3 = false;
      }
      std::ofstream::~ofstream(&dump_file);
    }
    std::filesystem::__cxx11::path::~path(&path.super_path);
  }
  std::__cxx11::string::~string((string *)&dump_filename);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool DumpWallet(const ArgsManager& args, WalletDatabase& db, bilingual_str& error)
{
    // Get the dumpfile
    std::string dump_filename = args.GetArg("-dumpfile", "");
    if (dump_filename.empty()) {
        error = _("No dump file provided. To use dump, -dumpfile=<filename> must be provided.");
        return false;
    }

    fs::path path = fs::PathFromString(dump_filename);
    path = fs::absolute(path);
    if (fs::exists(path)) {
        error = strprintf(_("File %s already exists. If you are sure this is what you want, move it out of the way first."), fs::PathToString(path));
        return false;
    }
    std::ofstream dump_file;
    dump_file.open(path);
    if (dump_file.fail()) {
        error = strprintf(_("Unable to open %s for writing"), fs::PathToString(path));
        return false;
    }

    HashWriter hasher{};

    std::unique_ptr<DatabaseBatch> batch = db.MakeBatch();

    bool ret = true;
    std::unique_ptr<DatabaseCursor> cursor = batch->GetNewCursor();
    if (!cursor) {
        error = _("Error: Couldn't create cursor into database");
        ret = false;
    }

    // Write out a magic string with version
    std::string line = strprintf("%s,%u\n", DUMP_MAGIC, DUMP_VERSION);
    dump_file.write(line.data(), line.size());
    hasher << Span{line};

    // Write out the file format
    std::string format = db.Format();
    // BDB files that are opened using BerkeleyRODatabase have it's format as "bdb_ro"
    // We want to override that format back to "bdb"
    if (format == "bdb_ro") {
        format = "bdb";
    }
    line = strprintf("%s,%s\n", "format", format);
    dump_file.write(line.data(), line.size());
    hasher << Span{line};

    if (ret) {

        // Read the records
        while (true) {
            DataStream ss_key{};
            DataStream ss_value{};
            DatabaseCursor::Status status = cursor->Next(ss_key, ss_value);
            if (status == DatabaseCursor::Status::DONE) {
                ret = true;
                break;
            } else if (status == DatabaseCursor::Status::FAIL) {
                error = _("Error reading next record from wallet database");
                ret = false;
                break;
            }
            std::string key_str = HexStr(ss_key);
            std::string value_str = HexStr(ss_value);
            line = strprintf("%s,%s\n", key_str, value_str);
            dump_file.write(line.data(), line.size());
            hasher << Span{line};
        }
    }

    cursor.reset();
    batch.reset();

    if (ret) {
        // Write the hash
        tfm::format(dump_file, "checksum,%s\n", HexStr(hasher.GetHash()));
        dump_file.close();
    } else {
        // Remove the dumpfile on failure
        dump_file.close();
        fs::remove(path);
    }

    return ret;
}